

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkGetBufNum(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pAVar1 = Abc_NtkObj(pNtk,i);
    if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) {
      iVar2 = iVar2 + (uint)((pAVar1->vFanins).nSize == 1);
    }
  }
  return iVar2;
}

Assistant:

int Abc_NtkGetBufNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        Counter += (Abc_ObjFaninNum(pNode) == 1);
    return Counter;
}